

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::anon_unknown_1::reducev<Ptex::v2_2::PtexHalf>
               (PtexHalf *src,int sstride,int uw,int vw,PtexHalf *dst,int dstride,int nchan)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  PtexHalf *in_RDI;
  undefined2 *in_R8;
  int in_R9D;
  float fVar2;
  float fVar3;
  PtexHalf *rowend;
  PtexHalf *end;
  int drowskip;
  int srowskip;
  int rowlen;
  float in_stack_ffffffffffffffbc;
  PtexHalf *this;
  undefined2 *local_20;
  PtexHalf *local_8;
  
  iVar1 = in_EDX * (int)rowend;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + in_ECX * (in_ESI / 2);
      local_8 = local_8 + ((in_ESI / 2) * 2 - iVar1)) {
    this = local_8 + iVar1;
    for (; local_8 != this; local_8 = local_8 + 1) {
      fVar2 = PtexHalf::operator_cast_to_float((PtexHalf *)0x13c621);
      fVar3 = PtexHalf::operator_cast_to_float((PtexHalf *)0x13c63b);
      halve(fVar2 + fVar3);
      PtexHalf::PtexHalf(this,in_stack_ffffffffffffffbc);
      *local_20 = (short)((uint)in_stack_ffffffffffffffbc >> 0x10);
      local_20 = local_20 + 1;
    }
    local_20 = local_20 + (in_R9D / 2 - iVar1);
  }
  return;
}

Assistant:

inline void reducev(const T* src, int sstride, int uw, int vw,
                        T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = 2*sstride - rowlen;
        int drowskip = dstride - rowlen;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src++)
                *dst++ = T(halve(src[0] + src[sstride]));
    }